

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O3

BN * __thiscall
BN::expLeftToRightK_ary
          (BN *__return_storage_ptr__,BN *this,BN *exponent,BN *mod,
          vector<BN,_std::allocator<BN>_> *g)

{
  ushort uVar1;
  pointer puVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  BN local_60;
  BN local_48;
  
  puVar2 = (exponent->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(exponent->ba).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar2) < 3) && (*puVar2 == 0)) {
    bn1();
  }
  else {
    bn1();
    uVar4 = (int)((ulong)((long)(exponent->ba).
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(exponent->ba).
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 1) - 1;
    if (-1 < (int)uVar4) {
      uVar5 = (ulong)uVar4;
      do {
        uVar1 = (exponent->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar5];
        uVar7 = 1;
        do {
          lVar6 = 8;
          do {
            Qrt(&local_60,__return_storage_ptr__);
            operator%(&local_48,&local_60,mod);
            if (&local_48 != __return_storage_ptr__) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
                        (&__return_storage_ptr__->ba,&local_48.ba);
            }
            if (local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.ba.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_60.ba.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
          karatsubaMultiplication
                    (&local_60,__return_storage_ptr__,
                     (BN *)((long)&(((g->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                                     super__Vector_impl_data._M_start)->ba).
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl +
                           (ulong)((uVar1 >> ((char)uVar7 * '\b' & 0x1fU) & 0xff) * 0x18)));
          operator%(&local_48,&local_60,mod);
          if (&local_48 != __return_storage_ptr__) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
                      (&__return_storage_ptr__->ba,&local_48.ba);
          }
          if (local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          uVar7 = uVar7 - 1;
        } while (uVar7 < 2);
        bVar3 = 0 < (long)uVar5;
        uVar5 = uVar5 - 1;
      } while (bVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::expLeftToRightK_ary(const BN& exponent, const BN& mod, const vector<BN>& g) const {
    if(exponent.is0())
        return BN::bn1();

    BN A(BN::bn1());
    for(int i = exponent.ba.size() - 1; i >= 0; i--) {
        bt value = exponent.ba[i];
        for (size_t b = bz - 1; b < bz; --b) {
            for(size_t k = 0; k < KaryBits; k++)
                A = A.Qrt() % mod;
            A = A * g[(value >> KaryBits * b) & KaryMask] % mod;
        }
    }
    return A;
}